

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

PKCS12 * PKCS12_create(char *pass,char *name,EVP_PKEY *pkey,X509 *cert,stack_st_X509 *ca,int nid_key
                      ,int nid_cert,int iter,int mac_iter,int keytype)

{
  undefined8 uVar1;
  undefined8 password_len_00;
  int iVar2;
  size_t sVar3;
  EVP_MD *pEVar4;
  EVP_CIPHER *cipher_00;
  undefined4 extraout_var;
  uint8_t *puVar5;
  uchar *puVar6;
  bool bVar7;
  size_t local_4b8;
  undefined1 local_4b0 [8];
  CBB digest_info;
  CBB mac_data;
  uchar local_448 [4];
  uint mac_len;
  uint8_t mac [64];
  uint8_t mac_salt [8];
  EVP_MD *mac_md;
  size_t name_len;
  EVP_CIPHER *cipher_1;
  CBB bag_contents;
  CBB bag;
  CBB safe_contents;
  CBB data_1;
  CBB wrapper_1;
  CBB content_info_1;
  undefined1 local_2c0 [4];
  int ok;
  CBB plaintext_cbb;
  EVP_CIPHER *cipher;
  CBB data;
  CBB wrapper;
  CBB content_info;
  uint8_t mac_key [64];
  CBB content_infos;
  CBB auth_safe_data;
  CBB auth_safe_wrapper;
  CBB auth_safe;
  CBB pfx;
  CBB cbb;
  PKCS12 *ret;
  uchar local_88 [4];
  uint key_id_len;
  uint8_t key_id [64];
  size_t password_len;
  int key_nid_local;
  stack_st_X509 *chain_local;
  X509 *cert_local;
  EVP_PKEY *pkey_local;
  char *name_local;
  char *password_local;
  
  password_len._4_4_ = nid_key;
  if (nid_key == 0) {
    password_len._4_4_ = 0x92;
  }
  if (nid_cert == 0) {
    nid_cert = 0x95;
  }
  if (iter == 0) {
    iter = 0x800;
  }
  if (mac_iter == 0) {
    mac_iter = 1;
  }
  if (((keytype != 0) || (mac_iter < 0)) ||
     ((pkey == (EVP_PKEY *)0x0 &&
      ((cert == (X509 *)0x0 && (sVar3 = sk_X509_num((stack_st_X509 *)ca), sVar3 == 0)))))) {
    ERR_put_error(0x13,0,0x84,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0x444);
    return (PKCS12 *)0x0;
  }
  if (pass == (char *)0x0) {
    local_4b8 = 0;
  }
  else {
    local_4b8 = strlen(pass);
  }
  key_id[0x38] = (undefined1)local_4b8;
  key_id[0x39] = local_4b8._1_1_;
  key_id[0x3a] = local_4b8._2_1_;
  key_id[0x3b] = local_4b8._3_1_;
  key_id[0x3c] = local_4b8._4_1_;
  key_id[0x3d] = local_4b8._5_1_;
  key_id[0x3e] = local_4b8._6_1_;
  key_id[0x3f] = local_4b8._7_1_;
  ret._4_4_ = 0;
  if ((cert != (X509 *)0x0) && (pkey != (EVP_PKEY *)0x0)) {
    iVar2 = X509_check_private_key(cert,pkey);
    if (iVar2 == 0) {
      return (PKCS12 *)0x0;
    }
    pEVar4 = EVP_sha1();
    iVar2 = X509_digest(cert,pEVar4,local_88,(uint *)((long)&ret + 4));
    if (iVar2 == 0) {
      return (PKCS12 *)0x0;
    }
  }
  cbb.u._24_8_ = 0;
  iVar2 = CBB_init((CBB *)((long)&pfx.u + 0x18),0);
  if (((((iVar2 == 0) ||
        (iVar2 = CBB_add_asn1((CBB *)((long)&pfx.u + 0x18),(CBB *)((long)&auth_safe.u + 0x18),
                              0x20000010), iVar2 == 0)) ||
       (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&auth_safe.u + 0x18),3), iVar2 == 0)) ||
      ((iVar2 = CBB_add_asn1((CBB *)((long)&auth_safe.u + 0x18),
                             (CBB *)((long)&auth_safe_wrapper.u + 0x18),0x20000010), iVar2 == 0 ||
       (iVar2 = CBB_add_asn1_element((CBB *)((long)&auth_safe_wrapper.u + 0x18),6,kPKCS7Data,9),
       iVar2 == 0)))) ||
     ((iVar2 = CBB_add_asn1((CBB *)((long)&auth_safe_wrapper.u + 0x18),
                            (CBB *)((long)&auth_safe_data.u + 0x18),0xa0000000), iVar2 == 0 ||
      ((iVar2 = CBB_add_asn1((CBB *)((long)&auth_safe_data.u + 0x18),
                             (CBB *)((long)&content_infos.u + 0x18),4), iVar2 == 0 ||
       (iVar2 = CBB_add_asn1((CBB *)((long)&content_infos.u + 0x18),(CBB *)(mac_key + 0x38),
                             0x20000010), iVar2 == 0)))))) goto LAB_00223bf5;
  if ((cert != (X509 *)0x0) || (sVar3 = sk_X509_num((stack_st_X509 *)ca), sVar3 != 0)) {
    if (nid_cert < 0) {
      iVar2 = CBB_add_asn1((CBB *)(mac_key + 0x38),(CBB *)((long)&wrapper.u + 0x18),0x20000010);
      if ((((iVar2 == 0) ||
           (iVar2 = CBB_add_asn1_element((CBB *)((long)&wrapper.u + 0x18),6,kPKCS7Data,9),
           iVar2 == 0)) ||
          (iVar2 = CBB_add_asn1((CBB *)((long)&wrapper.u + 0x18),(CBB *)((long)&data.u + 0x18),
                                0xa0000000), iVar2 == 0)) ||
         (((iVar2 = CBB_add_asn1((CBB *)((long)&data.u + 0x18),(CBB *)&cipher,4), iVar2 == 0 ||
           (iVar2 = add_cert_safe_contents
                              ((CBB *)&cipher,(X509 *)cert,(stack_st_X509 *)ca,name,local_88,
                               (ulong)ret._4_4_), iVar2 == 0)) ||
          (iVar2 = CBB_flush((CBB *)(mac_key + 0x38)), iVar2 == 0)))) goto LAB_00223bf5;
    }
    else {
      plaintext_cbb.u._24_8_ = pkcs5_pbe2_nid_to_cipher(nid_cert);
      if ((EVP_CIPHER *)plaintext_cbb.u._24_8_ != (EVP_CIPHER *)0x0) {
        nid_cert = -1;
      }
      iVar2 = CBB_init((CBB *)local_2c0,0);
      bVar7 = false;
      if (iVar2 != 0) {
        iVar2 = add_cert_safe_contents
                          ((CBB *)local_2c0,(X509 *)cert,(stack_st_X509 *)ca,name,local_88,
                           (ulong)ret._4_4_);
        password_len_00 = key_id._56_8_;
        uVar1 = plaintext_cbb.u._24_8_;
        bVar7 = false;
        if (iVar2 != 0) {
          puVar5 = CBB_data((CBB *)local_2c0);
          sVar3 = CBB_len((CBB *)local_2c0);
          iVar2 = add_encrypted_data((CBB *)(mac_key + 0x38),nid_cert,(EVP_CIPHER *)uVar1,pass,
                                     password_len_00,iter,puVar5,sVar3);
          bVar7 = iVar2 != 0;
        }
      }
      CBB_cleanup((CBB *)local_2c0);
      if (!bVar7) goto LAB_00223bf5;
    }
  }
  if (pkey != (EVP_PKEY *)0x0) {
    iVar2 = CBB_add_asn1((CBB *)(mac_key + 0x38),(CBB *)((long)&wrapper_1.u + 0x18),0x20000010);
    if (((iVar2 == 0) ||
        (iVar2 = CBB_add_asn1_element((CBB *)((long)&wrapper_1.u + 0x18),6,kPKCS7Data,9), iVar2 == 0
        )) || ((iVar2 = CBB_add_asn1((CBB *)((long)&wrapper_1.u + 0x18),
                                     (CBB *)((long)&data_1.u + 0x18),0xa0000000), iVar2 == 0 ||
               (((iVar2 = CBB_add_asn1((CBB *)((long)&data_1.u + 0x18),
                                       (CBB *)((long)&safe_contents.u + 0x18),4), iVar2 == 0 ||
                 (iVar2 = CBB_add_asn1((CBB *)((long)&safe_contents.u + 0x18),
                                       (CBB *)((long)&bag.u + 0x18),0x20000010), iVar2 == 0)) ||
                (iVar2 = CBB_add_asn1((CBB *)((long)&bag.u + 0x18),
                                      (CBB *)((long)&bag_contents.u + 0x18),0x20000010), iVar2 == 0)
                ))))) goto LAB_00223bf5;
    if (password_len._4_4_ < 0) {
      iVar2 = CBB_add_asn1_element((CBB *)((long)&bag_contents.u + 0x18),6,kKeyBag,0xb);
      if ((iVar2 == 0) ||
         (iVar2 = CBB_add_asn1((CBB *)((long)&bag_contents.u + 0x18),(CBB *)&cipher_1,0xa0000000),
         iVar2 == 0)) goto LAB_00223bf5;
      iVar2 = EVP_marshal_private_key((CBB *)&cipher_1,(EVP_PKEY *)pkey);
    }
    else {
      cipher_00 = pkcs5_pbe2_nid_to_cipher(password_len._4_4_);
      if (cipher_00 != (EVP_CIPHER *)0x0) {
        password_len._4_4_ = -1;
      }
      iVar2 = CBB_add_asn1_element((CBB *)((long)&bag_contents.u + 0x18),6,kPKCS8ShroudedKeyBag,0xb)
      ;
      if ((iVar2 == 0) ||
         (iVar2 = CBB_add_asn1((CBB *)((long)&bag_contents.u + 0x18),(CBB *)&cipher_1,0xa0000000),
         iVar2 == 0)) goto LAB_00223bf5;
      iVar2 = PKCS8_marshal_encrypted_private_key
                        ((CBB *)&cipher_1,password_len._4_4_,cipher_00,pass,key_id._56_8_,
                         (uint8_t *)0x0,0,iter,(EVP_PKEY *)pkey);
    }
    if (iVar2 == 0) goto LAB_00223bf5;
    mac_md = (EVP_MD *)0x0;
    if (name != (char *)0x0) {
      mac_md = (EVP_MD *)strlen(name);
    }
    iVar2 = add_bag_attributes((CBB *)((long)&bag_contents.u + 0x18),name,(size_t)mac_md,local_88,
                               (ulong)ret._4_4_);
    if ((iVar2 == 0) || (iVar2 = CBB_flush((CBB *)(mac_key + 0x38)), iVar2 == 0)) goto LAB_00223bf5;
  }
  pEVar4 = EVP_sha1();
  iVar2 = CBB_flush((CBB *)((long)&content_infos.u + 0x18));
  if ((iVar2 != 0) && (iVar2 = RAND_bytes(mac + 0x38,8), uVar1 = key_id._56_8_, iVar2 != 0)) {
    iVar2 = EVP_MD_size(pEVar4);
    iVar2 = pkcs12_key_gen(pass,uVar1,mac + 0x38,8,'\x03',mac_iter,CONCAT44(extraout_var,iVar2),
                           (uint8_t *)((long)&content_info.u + 0x18),(EVP_MD *)pEVar4);
    if (iVar2 != 0) {
      iVar2 = EVP_MD_size(pEVar4);
      puVar5 = CBB_data((CBB *)((long)&content_infos.u + 0x18));
      sVar3 = CBB_len((CBB *)((long)&content_infos.u + 0x18));
      puVar6 = HMAC(pEVar4,(void *)((long)&content_info.u + 0x18),iVar2,puVar5,sVar3,local_448,
                    (uint *)((long)&mac_data.u + 0x1c));
      if ((((((puVar6 != (uchar *)0x0) &&
             (iVar2 = CBB_add_asn1((CBB *)((long)&auth_safe.u + 0x18),
                                   (CBB *)((long)&digest_info.u + 0x18),0x20000010), iVar2 != 0)) &&
            (iVar2 = CBB_add_asn1((CBB *)((long)&digest_info.u + 0x18),(CBB *)local_4b0,0x20000010),
            iVar2 != 0)) &&
           ((iVar2 = EVP_marshal_digest_algorithm((CBB *)local_4b0,(EVP_MD *)pEVar4), iVar2 != 0 &&
            (iVar2 = CBB_add_asn1_octet_string
                               ((CBB *)local_4b0,local_448,(ulong)(uint)mac_data.u._28_4_),
            iVar2 != 0)))) &&
          ((iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&digest_info.u + 0x18),mac + 0x38,8),
           iVar2 != 0 &&
           (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&digest_info.u + 0x18),(long)mac_iter),
           iVar2 != 0)))) &&
         ((cbb.u._24_8_ = OPENSSL_malloc(0x10), (uint8_t **)cbb.u._24_8_ == (uint8_t **)0x0 ||
          (iVar2 = CBB_finish((CBB *)((long)&pfx.u + 0x18),(uint8_t **)cbb.u._24_8_,
                              (size_t *)(cbb.u._24_8_ + 8)), iVar2 == 0)))) {
        OPENSSL_free((void *)cbb.u._24_8_);
        cbb.u._24_8_ = 0;
      }
    }
  }
LAB_00223bf5:
  OPENSSL_cleanse((void *)((long)&content_info.u + 0x18),0x40);
  CBB_cleanup((CBB *)((long)&pfx.u + 0x18));
  return (PKCS12 *)cbb.u._24_8_;
}

Assistant:

PKCS12 *PKCS12_create(const char *password, const char *name,
                      const EVP_PKEY *pkey, X509 *cert,
                      const STACK_OF(X509) *chain, int key_nid, int cert_nid,
                      int iterations, int mac_iterations, int key_type) {
  // TODO(crbug.com/396434682): Improve these defaults.
  if (key_nid == 0) {
    key_nid = NID_pbe_WithSHA1And3_Key_TripleDES_CBC;
  }
  if (cert_nid == 0) {
    cert_nid = NID_pbe_WithSHA1And40BitRC2_CBC;
  }
  if (iterations == 0) {
    iterations = PKCS12_DEFAULT_ITER;
  }
  if (mac_iterations == 0) {
    mac_iterations = 1;
  }
  if (  // In OpenSSL, this specifies a non-standard Microsoft key usage
        // extension which we do not currently support.
      key_type != 0 ||
      // In OpenSSL, -1 here means to omit the MAC, which we do not
      // currently support. Omitting it is also invalid for a password-based
      // PKCS#12 file.
      mac_iterations < 0 ||
      // Don't encode empty objects.
      (pkey == NULL && cert == NULL && sk_X509_num(chain) == 0)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_OPTIONS);
    return 0;
  }

  // PKCS#12 is a very confusing recursive data format, built out of another
  // recursive data format. Section 5.1 of RFC 7292 describes the encoding
  // algorithm, but there is no clear overview. A quick summary:
  //
  // PKCS#7 defines a ContentInfo structure, which is a overgeneralized typed
  // combinator structure for applying cryptography. We care about two types. A
  // data ContentInfo contains an OCTET STRING and is a leaf node of the
  // combinator tree. An encrypted-data ContentInfo contains encryption
  // parameters (key derivation and encryption) and wraps another ContentInfo,
  // usually data.
  //
  // A PKCS#12 file is a PFX structure (section 4), which contains a single data
  // ContentInfo and a MAC over it. This root ContentInfo is the
  // AuthenticatedSafe and its payload is a SEQUENCE of other ContentInfos, so
  // that different parts of the PKCS#12 file can by differently protected.
  //
  // Each ContentInfo in the AuthenticatedSafe, after undoing all the PKCS#7
  // combinators, has SafeContents payload. A SafeContents is a SEQUENCE of
  // SafeBag. SafeBag is PKCS#12's typed structure, with subtypes such as KeyBag
  // and CertBag. Confusingly, there is a SafeContents bag type which itself
  // recursively contains more SafeBags, but we do not implement this. Bags also
  // can have attributes.
  //
  // The grouping of SafeBags into intermediate ContentInfos does not appear to
  // be significant, except that all SafeBags sharing a ContentInfo have the
  // same level of protection. Additionally, while keys may be encrypted by
  // placing a KeyBag in an encrypted-data ContentInfo, PKCS#12 also defines a
  // key-specific encryption container, PKCS8ShroudedKeyBag, which is used
  // instead.

  // Note that |password| may be NULL to specify no password, rather than the
  // empty string. They are encoded differently in PKCS#12. (One is the empty
  // byte array and the other is NUL-terminated UCS-2.)
  size_t password_len = password != NULL ? strlen(password) : 0;

  uint8_t key_id[EVP_MAX_MD_SIZE];
  unsigned key_id_len = 0;
  if (cert != NULL && pkey != NULL) {
    if (!X509_check_private_key(cert, pkey) ||
        // Matching OpenSSL, use the SHA-1 hash of the certificate as the local
        // key ID. Some PKCS#12 consumers require one to connect the private key
        // and certificate.
        !X509_digest(cert, EVP_sha1(), key_id, &key_id_len)) {
      return 0;
    }
  }

  // See https://tools.ietf.org/html/rfc7292#section-4.
  PKCS12 *ret = NULL;
  CBB cbb, pfx, auth_safe, auth_safe_wrapper, auth_safe_data, content_infos;
  uint8_t mac_key[EVP_MAX_MD_SIZE];
  if (!CBB_init(&cbb, 0) || !CBB_add_asn1(&cbb, &pfx, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&pfx, 3) ||
      // auth_safe is a data ContentInfo.
      !CBB_add_asn1(&pfx, &auth_safe, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&auth_safe, CBS_ASN1_OBJECT, kPKCS7Data,
                            sizeof(kPKCS7Data)) ||
      !CBB_add_asn1(&auth_safe, &auth_safe_wrapper,
                    CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
      !CBB_add_asn1(&auth_safe_wrapper, &auth_safe_data,
                    CBS_ASN1_OCTETSTRING) ||
      // See https://tools.ietf.org/html/rfc7292#section-4.1. |auth_safe|'s
      // contains a SEQUENCE of ContentInfos.
      !CBB_add_asn1(&auth_safe_data, &content_infos, CBS_ASN1_SEQUENCE)) {
    goto err;
  }

  // If there are any certificates, place them in CertBags wrapped in a single
  // encrypted ContentInfo.
  if (cert != NULL || sk_X509_num(chain) > 0) {
    if (cert_nid < 0) {
      // Place the certificates in an unencrypted ContentInfo. This could be
      // more compactly-encoded by reusing the same ContentInfo as the key, but
      // OpenSSL does not do this. We keep them separate for consistency. (Keys,
      // even when encrypted, are always placed in unencrypted ContentInfos.
      // PKCS#12 defines bag-level encryption for keys.)
      CBB content_info, wrapper, data;
      if (!CBB_add_asn1(&content_infos, &content_info, CBS_ASN1_SEQUENCE) ||
          !CBB_add_asn1_element(&content_info, CBS_ASN1_OBJECT, kPKCS7Data,
                                sizeof(kPKCS7Data)) ||
          !CBB_add_asn1(&content_info, &wrapper,
                        CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
          !CBB_add_asn1(&wrapper, &data, CBS_ASN1_OCTETSTRING) ||
          !add_cert_safe_contents(&data, cert, chain, name, key_id,
                                  key_id_len) ||
          !CBB_flush(&content_infos)) {
        goto err;
      }
    } else {
      // This function differs from other OpenSSL functions in how PBES1 and
      // PBES2 schemes are selected. If the NID matches a cipher, treat this as
      // PBES2 instead. Convert to the other convention.
      const EVP_CIPHER *cipher = pkcs5_pbe2_nid_to_cipher(cert_nid);
      if (cipher != nullptr) {
        cert_nid = -1;
      }
      CBB plaintext_cbb;
      int ok =
          CBB_init(&plaintext_cbb, 0) &&
          add_cert_safe_contents(&plaintext_cbb, cert, chain, name, key_id,
                                 key_id_len) &&
          add_encrypted_data(&content_infos, cert_nid, cipher, password,
                             password_len, iterations, CBB_data(&plaintext_cbb),
                             CBB_len(&plaintext_cbb));
      CBB_cleanup(&plaintext_cbb);
      if (!ok) {
        goto err;
      }
    }
  }

  // If there is a key, place it in a single KeyBag or PKCS8ShroudedKeyBag
  // wrapped in an unencrypted ContentInfo. (One could also place it in a KeyBag
  // inside an encrypted ContentInfo, but OpenSSL does not do this and some
  // PKCS#12 consumers do not support KeyBags.)
  if (pkey != NULL) {
    CBB content_info, wrapper, data, safe_contents, bag, bag_contents;
    if (  // Add another data ContentInfo.
        !CBB_add_asn1(&content_infos, &content_info, CBS_ASN1_SEQUENCE) ||
        !CBB_add_asn1_element(&content_info, CBS_ASN1_OBJECT, kPKCS7Data,
                              sizeof(kPKCS7Data)) ||
        !CBB_add_asn1(&content_info, &wrapper,
                      CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
        !CBB_add_asn1(&wrapper, &data, CBS_ASN1_OCTETSTRING) ||
        !CBB_add_asn1(&data, &safe_contents, CBS_ASN1_SEQUENCE) ||
        // Add a SafeBag containing a PKCS8ShroudedKeyBag.
        !CBB_add_asn1(&safe_contents, &bag, CBS_ASN1_SEQUENCE)) {
      goto err;
    }
    if (key_nid < 0) {
      if (!CBB_add_asn1_element(&bag, CBS_ASN1_OBJECT, kKeyBag,
                                sizeof(kKeyBag)) ||
          !CBB_add_asn1(&bag, &bag_contents,
                        CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
          !EVP_marshal_private_key(&bag_contents, pkey)) {
        goto err;
      }
    } else {
      // This function differs from other OpenSSL functions in how PBES1 and
      // PBES2 schemes are selected. If the NID matches a cipher, treat this as
      // PBES2 instead. Convert to the other convention.
      const EVP_CIPHER *cipher = pkcs5_pbe2_nid_to_cipher(key_nid);
      if (cipher != nullptr) {
        key_nid = -1;
      }
      if (!CBB_add_asn1_element(&bag, CBS_ASN1_OBJECT, kPKCS8ShroudedKeyBag,
                                sizeof(kPKCS8ShroudedKeyBag)) ||
          !CBB_add_asn1(&bag, &bag_contents,
                        CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
          !PKCS8_marshal_encrypted_private_key(
              &bag_contents, key_nid, cipher, password, password_len,
              NULL /* generate a random salt */,
              0 /* use default salt length */, iterations, pkey)) {
        goto err;
      }
    }
    size_t name_len = 0;
    if (name) {
      name_len = strlen(name);
    }
    if (!add_bag_attributes(&bag, name, name_len, key_id, key_id_len) ||
        !CBB_flush(&content_infos)) {
      goto err;
    }
  }

  {
    // Compute the MAC. Match OpenSSL in using SHA-1 as the hash function. The
    // MAC covers |auth_safe_data|.
    const EVP_MD *mac_md = EVP_sha1();
    uint8_t mac_salt[PKCS5_SALT_LEN];
    uint8_t mac[EVP_MAX_MD_SIZE];
    unsigned mac_len;
    if (!CBB_flush(&auth_safe_data) ||
        !RAND_bytes(mac_salt, sizeof(mac_salt)) ||
        !pkcs12_key_gen(password, password_len, mac_salt, sizeof(mac_salt),
                        PKCS12_MAC_ID, mac_iterations, EVP_MD_size(mac_md),
                        mac_key, mac_md) ||
        !HMAC(mac_md, mac_key, EVP_MD_size(mac_md), CBB_data(&auth_safe_data),
              CBB_len(&auth_safe_data), mac, &mac_len)) {
      goto err;
    }

    CBB mac_data, digest_info;
    if (!CBB_add_asn1(&pfx, &mac_data, CBS_ASN1_SEQUENCE) ||
        !CBB_add_asn1(&mac_data, &digest_info, CBS_ASN1_SEQUENCE) ||
        // OpenSSL and NSS always include a NULL parameter with the digest
        // algorithm. Windows does not. RFC 7292 imports DigestInfo from PKCS
        // #7. PKCS #7 does not actually use DigestInfo. It just describes
        // RSASSA-PKCS1-v1_5 signing as encoding a DigestInfo and then
        // "encrypting" it with the private key. In that context, NULL should be
        // included. Confusingly, there is also a digestAlgorithm field in
        // SignerInfo. There, RFC 5754 says to omit the NULL. But that field
        // does not use DigestInfo per se.
        //
        // We match OpenSSL, NSS, and RSASSA-PKCS1-v1_5 in including the NULL.
        !EVP_marshal_digest_algorithm(&digest_info, mac_md) ||
        !CBB_add_asn1_octet_string(&digest_info, mac, mac_len) ||
        !CBB_add_asn1_octet_string(&mac_data, mac_salt, sizeof(mac_salt)) ||
        // The iteration count has a DEFAULT of 1, but RFC 7292 says "The
        // default is for historical reasons and its use is deprecated." Thus we
        // explicitly encode the iteration count, though it is not valid DER.
        !CBB_add_asn1_uint64(&mac_data, mac_iterations)) {
      goto err;
    }

    ret = reinterpret_cast<PKCS12 *>(OPENSSL_malloc(sizeof(PKCS12)));
    if (ret == NULL || !CBB_finish(&cbb, &ret->ber_bytes, &ret->ber_len)) {
      OPENSSL_free(ret);
      ret = NULL;
      goto err;
    }
  }

err:
  OPENSSL_cleanse(mac_key, sizeof(mac_key));
  CBB_cleanup(&cbb);
  return ret;
}